

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::
Fold_Right_Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::do_oper(Fold_Right_Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
          *this,Dispatch_State *t_ss,string *t_oper_string,Boxed_Value *t_lhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value *in_R8;
  long lVar2;
  Boxed_Value BVar3;
  string_view t_name;
  array<chaiscript::Boxed_Value,_2UL> params;
  undefined8 uStack_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  Type_Conversions *local_78;
  Conversion_Saves *local_70;
  undefined1 *local_68;
  Conversion_Saves *local_60;
  anon_class_24_3_1b4046b4 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  if (((((in_R8->m_data).
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       m_type_info).m_flags & 0x10) == 0) {
    chaiscript::detail::Dispatch_Engine::new_function_call
              ((Dispatch_Engine *)(t_oper_string->_M_dataplus)._M_p,
               (Stack_Holder *)t_oper_string->_M_string_length,
               *(Conversion_Saves **)((long)&t_oper_string->field_2 + 8));
    local_88 = (in_R8->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_80 = (in_R8->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_80->_M_use_count = local_80->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_80->_M_use_count = local_80->_M_use_count + 1;
      }
    }
    local_78 = t_ss[3].m_conversions.m_conversions._M_data;
    local_70 = t_ss[3].m_conversions.m_saves._M_data;
    if (local_70 != (Conversion_Saves *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(local_70->saves).
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(local_70->saves).
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        *(int *)&(local_70->saves).
                 super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                 ._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(local_70->saves).
                      super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    local_68 = (undefined1 *)&local_88;
    local_60 = (Conversion_Saves *)&local_68;
    chaiscript::detail::Dispatch_Engine::save_function_params
              ((Dispatch_Engine *)(t_oper_string->_M_dataplus)._M_p,(Function_Params *)&local_68);
    t_name._M_str =
         (char *)(t_lhs->m_data).
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
    t_name._M_len = (size_t)(t_oper_string->_M_dataplus)._M_p;
    local_68 = (undefined1 *)&local_88;
    local_60 = (Conversion_Saves *)&local_68;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name,
               (atomic_uint_fast32_t *)
               (t_lhs->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (Function_Params *)(t_ss + 4),(Type_Conversions_State *)&local_68);
    lVar2 = 0x20;
    do {
      if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_90 + lVar2) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&uStack_90 + lVar2));
      }
      lVar2 = lVar2 + -0x10;
    } while (lVar2 != 0);
    chaiscript::detail::Dispatch_Engine::pop_function_call
              ((Dispatch_Engine *)(t_oper_string->_M_dataplus)._M_p,
               (Stack_Holder *)t_oper_string->_M_string_length,
               *(Conversion_Saves **)((long)&t_oper_string->field_2 + 8));
    _Var1._M_pi = extraout_RDX;
  }
  else {
    local_48.t_oper = *(Opers *)&t_ss[3].m_stack_holder._M_data;
    local_48.t_rhs = (Boxed_Value *)&t_ss[3].m_conversions;
    BVar3 = Boxed_Number::
            visit<chaiscript::Boxed_Number::oper(chaiscript::Operators::Opers,chaiscript::Boxed_Value_const&,chaiscript::Boxed_Value_const&)::_lambda(auto:1_const&)_1_&>
                      ((Boxed_Number *)this,in_R8,&local_48);
    _Var1._M_pi = BVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_oper(const chaiscript::detail::Dispatch_State &t_ss, const std::string &t_oper_string, const Boxed_Value &t_lhs) const {
        try {
          if (t_lhs.get_type_info().is_arithmetic()) {
            // If it's an arithmetic operation we want to short circuit dispatch
            try {
              return Boxed_Number::do_oper(m_oper, t_lhs, m_rhs);
            } catch (const chaiscript::exception::arithmetic_error &) {
              throw;
            } catch (...) {
              throw exception::eval_error("Error with numeric operator calling: " + t_oper_string);
            }
          } else {
            chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
            std::array<Boxed_Value, 2> params{t_lhs, m_rhs};
            fpp.save_params(Function_Params{params});
            return t_ss->call_function(t_oper_string, m_loc, Function_Params{params}, t_ss.conversions());
          }
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Can not find appropriate '" + t_oper_string + "' operator.", e.parameters, e.functions, false, *t_ss);
        }
      }